

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdso_support.cc
# Opt level: O1

void * __thiscall
absl::lts_20250127::debugging_internal::VDSOSupport::SetBase(VDSOSupport *this,void *base)

{
  byte bVar1;
  uint32_t uVar2;
  bool bVar3;
  undefined *puVar4;
  undefined8 extraout_RAX;
  undefined7 uVar5;
  undefined8 extraout_RAX_00;
  undefined8 *extraout_RDX;
  SymbolIterator SStack_60;
  
  puVar4 = vdso_base_;
  if ((undefined4 *)base != &ElfMemImage::kInvalidBaseSentinel) {
    vdso_base_ = (undefined *)base;
    ElfMemImage::Init(&this->image_,base);
    getcpu_fn_ = InitAndGetCPU;
    return puVar4;
  }
  SetBase();
  SStack_60.index_ = 0;
  SStack_60.image_ = this;
  ElfMemImage::SymbolIterator::Update(&SStack_60,0);
  uVar2 = (this->image_).num_syms_;
  uVar5 = (undefined7)((ulong)extraout_RAX >> 8);
  bVar3 = SStack_60.index_ != uVar2 || (VDSOSupport *)SStack_60.image_ != this;
  if (SStack_60.index_ != uVar2 || (VDSOSupport *)SStack_60.image_ != this) {
    do {
      if ((SStack_60.info_.address <= base) &&
         (base < (void *)((long)SStack_60.info_.address + (SStack_60.info_.symbol)->st_size))) {
        if (extraout_RDX == (undefined8 *)0x0) break;
        bVar1 = (SStack_60.info_.symbol)->st_info;
        extraout_RDX[2] = SStack_60.info_.address;
        extraout_RDX[3] = SStack_60.info_.symbol;
        *extraout_RDX = SStack_60.info_.name;
        extraout_RDX[1] = SStack_60.info_.version;
        if ((bVar1 & 0xf0) == 0x10) break;
      }
      ElfMemImage::SymbolIterator::Update(&SStack_60,1);
      uVar5 = (undefined7)((ulong)extraout_RAX_00 >> 8);
      bVar3 = SStack_60.index_ != uVar2 || (VDSOSupport *)SStack_60.image_ != this;
    } while (bVar3);
  }
  return (void *)CONCAT71(uVar5,bVar3);
}

Assistant:

const void *VDSOSupport::SetBase(const void *base) {
  ABSL_RAW_CHECK(base != debugging_internal::ElfMemImage::kInvalidBase,
                 "internal error");
  const void *old_base = vdso_base_.load(std::memory_order_relaxed);
  vdso_base_.store(base, std::memory_order_relaxed);
  image_.Init(base);
  // Also reset getcpu_fn_, so GetCPU could be tested with simulated VDSO.
  getcpu_fn_.store(&InitAndGetCPU, std::memory_order_relaxed);
  return old_base;
}